

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Deserializer::ClipMemory
          (BP4Deserializer *this,string *variableName,IO *io,
          vector<char,_std::allocator<char>_> *contiguousMemory,Box<Dims> *blockBox,
          Box<Dims> *intersectionBox)

{
  DataType DVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  DataType DVar6;
  DataType DVar7;
  DataType DVar8;
  DataType DVar9;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pVVar10;
  Variable<char> *pVVar11;
  Variable<signed_char> *pVVar12;
  Variable<short> *pVVar13;
  Variable<int> *pVVar14;
  Variable<long> *pVVar15;
  Variable<unsigned_char> *pVVar16;
  Variable<unsigned_short> *pVVar17;
  Variable<unsigned_int> *pVVar18;
  Variable<unsigned_long> *pVVar19;
  Variable<float> *pVVar20;
  Variable<double> *pVVar21;
  Variable<long_double> *pVVar22;
  Variable<std::complex<float>_> *dest;
  Variable<std::complex<double>_> *destStart;
  Dims *in_RDI;
  Variable<std::complex<double>_> *variable_14;
  Variable<std::complex<float>_> *variable_13;
  Variable<long_double> *variable_12;
  Variable<double> *variable_11;
  Variable<float> *variable_10;
  Variable<unsigned_long> *variable_9;
  Variable<unsigned_int> *variable_8;
  Variable<unsigned_short> *variable_7;
  Variable<unsigned_char> *variable_6;
  Variable<long> *variable_5;
  Variable<int> *variable_4;
  Variable<short> *variable_3;
  Variable<signed_char> *variable_2;
  Variable<char> *variable_1;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable;
  DataType type;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  DataType DVar23;
  string *in_stack_ffffffffffffff50;
  IO *in_stack_ffffffffffffff58;
  MemorySpace in_stack_ffffffffffffff88;
  
  DVar1 = core::IO::InquireVariableType
                    ((IO *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (DVar1 != Struct) {
    DVar23 = DVar1;
    DVar2 = helper::GetDataType<std::__cxx11::string>();
    if (DVar23 == DVar2) {
      pVVar10 = core::IO::InquireVariable<std::__cxx11::string>
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if (pVVar10 !=
          (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        helper::ClipContiguousMemory<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff58,(Dims *)in_stack_ffffffffffffff50,in_RDI,
                   (vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,in_stack_ffffffffffffff40)
                   ,(Box<Dims> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (Box<Dims> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
                   SUB41((uint)in_stack_ffffffffffffff2c >> 0x10,0),
                   SUB41((uint)in_stack_ffffffffffffff2c >> 8,0),in_stack_ffffffffffffff88);
      }
    }
    else {
      DVar2 = DVar1;
      DVar3 = helper::GetDataType<char>();
      if (DVar2 == DVar3) {
        pVVar11 = core::IO::InquireVariable<char>
                            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        if (pVVar11 != (Variable<char> *)0x0) {
          helper::ClipContiguousMemory<char>
                    ((char *)in_stack_ffffffffffffff58,(Dims *)in_stack_ffffffffffffff50,in_RDI,
                     (vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                     (Box<Dims> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (Box<Dims> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
                     SUB41((uint)in_stack_ffffffffffffff2c >> 0x10,0),
                     SUB41((uint)in_stack_ffffffffffffff2c >> 8,0),in_stack_ffffffffffffff88);
        }
      }
      else {
        DVar3 = DVar1;
        DVar4 = helper::GetDataType<signed_char>();
        if (DVar3 == DVar4) {
          pVVar12 = core::IO::InquireVariable<signed_char>
                              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          if (pVVar12 != (Variable<signed_char> *)0x0) {
            helper::ClipContiguousMemory<signed_char>
                      ((char *)in_stack_ffffffffffffff58,(Dims *)in_stack_ffffffffffffff50,in_RDI,
                       (vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                       (Box<Dims> *)CONCAT44(DVar3,in_stack_ffffffffffffff38),
                       (Box<Dims> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
                       SUB41((uint)in_stack_ffffffffffffff2c >> 0x10,0),
                       SUB41((uint)in_stack_ffffffffffffff2c >> 8,0),in_stack_ffffffffffffff88);
          }
        }
        else {
          DVar4 = DVar1;
          DVar5 = helper::GetDataType<short>();
          if (DVar4 == DVar5) {
            pVVar13 = core::IO::InquireVariable<short>
                                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
            if (pVVar13 != (Variable<short> *)0x0) {
              helper::ClipContiguousMemory<short>
                        ((short *)in_stack_ffffffffffffff58,(Dims *)in_stack_ffffffffffffff50,in_RDI
                         ,(vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                         (Box<Dims> *)CONCAT44(DVar3,DVar4),
                         (Box<Dims> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
                         SUB41((uint)in_stack_ffffffffffffff2c >> 0x10,0),
                         SUB41((uint)in_stack_ffffffffffffff2c >> 8,0),in_stack_ffffffffffffff88);
            }
          }
          else {
            DVar5 = DVar1;
            DVar6 = helper::GetDataType<int>();
            if (DVar5 == DVar6) {
              pVVar14 = core::IO::InquireVariable<int>
                                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
              if (pVVar14 != (Variable<int> *)0x0) {
                helper::ClipContiguousMemory<int>
                          ((int *)in_stack_ffffffffffffff58,(Dims *)in_stack_ffffffffffffff50,in_RDI
                           ,(vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                           (Box<Dims> *)CONCAT44(DVar3,DVar4),
                           (Box<Dims> *)CONCAT44(DVar5,in_stack_ffffffffffffff30),
                           SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
                           SUB41((uint)in_stack_ffffffffffffff2c >> 0x10,0),
                           SUB41((uint)in_stack_ffffffffffffff2c >> 8,0),in_stack_ffffffffffffff88);
              }
            }
            else {
              DVar6 = DVar1;
              DVar7 = helper::GetDataType<long>();
              if (DVar6 == DVar7) {
                pVVar15 = core::IO::InquireVariable<long>
                                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
                if (pVVar15 != (Variable<long> *)0x0) {
                  helper::ClipContiguousMemory<long>
                            ((long *)in_stack_ffffffffffffff58,(Dims *)in_stack_ffffffffffffff50,
                             in_RDI,(vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                             (Box<Dims> *)CONCAT44(DVar3,DVar4),(Box<Dims> *)CONCAT44(DVar5,DVar6),
                             SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
                             SUB41((uint)in_stack_ffffffffffffff2c >> 0x10,0),
                             SUB41((uint)in_stack_ffffffffffffff2c >> 8,0),in_stack_ffffffffffffff88
                            );
                }
              }
              else {
                DVar7 = DVar1;
                DVar8 = helper::GetDataType<unsigned_char>();
                if (DVar7 == DVar8) {
                  pVVar16 = core::IO::InquireVariable<unsigned_char>
                                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
                  if (pVVar16 != (Variable<unsigned_char> *)0x0) {
                    helper::ClipContiguousMemory<unsigned_char>
                              ((uchar *)in_stack_ffffffffffffff58,(Dims *)in_stack_ffffffffffffff50,
                               in_RDI,(vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                               (Box<Dims> *)CONCAT44(DVar3,DVar4),(Box<Dims> *)CONCAT44(DVar5,DVar6)
                               ,SUB41(DVar7 >> 0x18,0),SUB41(DVar7 >> 0x10,0),SUB41(DVar7 >> 8,0),
                               in_stack_ffffffffffffff88);
                  }
                }
                else {
                  DVar8 = helper::GetDataType<unsigned_short>();
                  if (DVar1 == DVar8) {
                    pVVar17 = core::IO::InquireVariable<unsigned_short>
                                        (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
                    if (pVVar17 != (Variable<unsigned_short> *)0x0) {
                      helper::ClipContiguousMemory<unsigned_short>
                                ((unsigned_short *)in_stack_ffffffffffffff58,
                                 (Dims *)in_stack_ffffffffffffff50,in_RDI,
                                 (vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                                 (Box<Dims> *)CONCAT44(DVar3,DVar4),
                                 (Box<Dims> *)CONCAT44(DVar5,DVar6),SUB41(DVar7 >> 0x18,0),
                                 SUB41(DVar7 >> 0x10,0),SUB41(DVar7 >> 8,0),(MemorySpace)pVVar17);
                    }
                  }
                  else {
                    DVar8 = DVar1;
                    DVar9 = helper::GetDataType<unsigned_int>();
                    if (DVar8 == DVar9) {
                      pVVar18 = core::IO::InquireVariable<unsigned_int>
                                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
                      if (pVVar18 != (Variable<unsigned_int> *)0x0) {
                        helper::ClipContiguousMemory<unsigned_int>
                                  ((uint *)in_stack_ffffffffffffff58,
                                   (Dims *)in_stack_ffffffffffffff50,in_RDI,
                                   (vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                                   (Box<Dims> *)CONCAT44(DVar3,DVar4),
                                   (Box<Dims> *)CONCAT44(DVar5,DVar6),SUB41(DVar7 >> 0x18,0),
                                   SUB41(DVar7 >> 0x10,0),SUB41(DVar7 >> 8,0),
                                   in_stack_ffffffffffffff88);
                      }
                    }
                    else {
                      DVar8 = DVar1;
                      DVar9 = helper::GetDataType<unsigned_long>();
                      if (DVar8 == DVar9) {
                        pVVar19 = core::IO::InquireVariable<unsigned_long>
                                            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
                        if (pVVar19 != (Variable<unsigned_long> *)0x0) {
                          helper::ClipContiguousMemory<unsigned_long>
                                    ((unsigned_long *)in_stack_ffffffffffffff58,
                                     (Dims *)in_stack_ffffffffffffff50,in_RDI,
                                     (vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2),
                                     (Box<Dims> *)CONCAT44(DVar3,DVar4),
                                     (Box<Dims> *)CONCAT44(DVar5,DVar6),SUB41(DVar7 >> 0x18,0),
                                     SUB41(DVar7 >> 0x10,0),SUB41(DVar7 >> 8,0),
                                     in_stack_ffffffffffffff88);
                        }
                      }
                      else {
                        DVar8 = DVar1;
                        DVar9 = helper::GetDataType<float>();
                        if (DVar8 == DVar9) {
                          pVVar20 = core::IO::InquireVariable<float>
                                              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
                          if (pVVar20 != (Variable<float> *)0x0) {
                            helper::ClipContiguousMemory<float>
                                      ((float *)in_stack_ffffffffffffff58,
                                       (Dims *)in_stack_ffffffffffffff50,in_RDI,
                                       (vector<char,_std::allocator<char>_> *)CONCAT44(DVar23,DVar2)
                                       ,(Box<Dims> *)CONCAT44(DVar3,DVar4),
                                       (Box<Dims> *)CONCAT44(DVar5,DVar6),SUB41(DVar7 >> 0x18,0),
                                       SUB41(DVar7 >> 0x10,0),SUB41(DVar7 >> 8,0),
                                       in_stack_ffffffffffffff88);
                          }
                        }
                        else {
                          DVar8 = DVar1;
                          DVar9 = helper::GetDataType<double>();
                          if (DVar8 == DVar9) {
                            pVVar21 = core::IO::InquireVariable<double>
                                                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                                                );
                            if (pVVar21 != (Variable<double> *)0x0) {
                              helper::ClipContiguousMemory<double>
                                        ((double *)in_stack_ffffffffffffff58,
                                         (Dims *)in_stack_ffffffffffffff50,in_RDI,
                                         (vector<char,_std::allocator<char>_> *)
                                         CONCAT44(DVar23,DVar2),(Box<Dims> *)CONCAT44(DVar3,DVar4),
                                         (Box<Dims> *)CONCAT44(DVar5,DVar6),SUB41(DVar7 >> 0x18,0),
                                         SUB41(DVar7 >> 0x10,0),SUB41(DVar7 >> 8,0),
                                         in_stack_ffffffffffffff88);
                            }
                          }
                          else {
                            DVar8 = helper::GetDataType<long_double>();
                            if (DVar1 == DVar8) {
                              pVVar22 = core::IO::InquireVariable<long_double>
                                                  (in_stack_ffffffffffffff58,
                                                   in_stack_ffffffffffffff50);
                              if (pVVar22 != (Variable<long_double> *)0x0) {
                                helper::ClipContiguousMemory<long_double>
                                          ((longdouble *)in_stack_ffffffffffffff58,
                                           (Dims *)in_stack_ffffffffffffff50,in_RDI,
                                           (vector<char,_std::allocator<char>_> *)
                                           CONCAT44(DVar23,DVar2),(Box<Dims> *)CONCAT44(DVar3,DVar4)
                                           ,(Box<Dims> *)CONCAT44(DVar5,DVar6),
                                           SUB41(DVar7 >> 0x18,0),SUB41(DVar7 >> 0x10,0),
                                           SUB41(DVar7 >> 8,0),in_stack_ffffffffffffff88);
                              }
                            }
                            else {
                              DVar8 = helper::GetDataType<std::complex<float>>();
                              if (DVar1 == DVar8) {
                                dest = core::IO::InquireVariable<std::complex<float>>
                                                 (in_stack_ffffffffffffff58,
                                                  in_stack_ffffffffffffff50);
                                if (dest != (Variable<std::complex<float>_> *)0x0) {
                                  helper::ClipContiguousMemory<std::complex<float>>
                                            ((complex<float> *)dest,
                                             (Dims *)in_stack_ffffffffffffff50,in_RDI,
                                             (vector<char,_std::allocator<char>_> *)
                                             CONCAT44(DVar23,DVar2),
                                             (Box<Dims> *)CONCAT44(DVar3,DVar4),
                                             (Box<Dims> *)CONCAT44(DVar5,DVar6),
                                             SUB41(DVar7 >> 0x18,0),SUB41(DVar7 >> 0x10,0),
                                             SUB41(DVar7 >> 8,0),in_stack_ffffffffffffff88);
                                }
                              }
                              else {
                                DVar8 = helper::GetDataType<std::complex<double>>();
                                if ((DVar1 == DVar8) &&
                                   (destStart = core::IO::InquireVariable<std::complex<double>>
                                                          (in_stack_ffffffffffffff58,
                                                           in_stack_ffffffffffffff50),
                                   destStart != (Variable<std::complex<double>_> *)0x0)) {
                                  helper::ClipContiguousMemory<std::complex<double>>
                                            ((complex<double> *)in_stack_ffffffffffffff58,
                                             (Dims *)destStart,in_RDI,
                                             (vector<char,_std::allocator<char>_> *)
                                             CONCAT44(DVar23,DVar2),
                                             (Box<Dims> *)CONCAT44(DVar3,DVar4),
                                             (Box<Dims> *)CONCAT44(DVar5,DVar6),
                                             SUB41(DVar7 >> 0x18,0),SUB41(DVar7 >> 0x10,0),
                                             SUB41(DVar7 >> 8,0),in_stack_ffffffffffffff88);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void BP4Deserializer::ClipMemory(const std::string &variableName, core::IO &io,
                                 const std::vector<char> &contiguousMemory,
                                 const Box<Dims> &blockBox, const Box<Dims> &intersectionBox) const
{
    const DataType type(io.InquireVariableType(variableName));

    if (type == DataType::Struct)
    {
    }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Variable<T> *variable = io.InquireVariable<T>(variableName);                         \
        if (variable != nullptr)                                                                   \
        {                                                                                          \
            helper::ClipContiguousMemory(variable->m_Data, variable->m_Start, variable->m_Count,   \
                                         contiguousMemory, blockBox, intersectionBox,              \
                                         m_IsRowMajor, m_ReverseDimensions);                       \
        }                                                                                          \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
}